

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symArrays.cpp
# Opt level: O1

bool ValidInput(char **argv,int *numbers)

{
  long lVar1;
  ostream *poVar2;
  bool bVar3;
  int i;
  long lVar4;
  char *endPtr;
  char *pcStack_38;
  
  bVar3 = true;
  lVar4 = 1;
  do {
    lVar1 = strtol(argv[lVar4],&pcStack_38,10);
    if (lVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Invalid num at argument ",0x18);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!",1);
LAB_001016ab:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      bVar3 = false;
    }
    else {
      lVar1 = strtol(argv[lVar4],&pcStack_38,10);
      numbers[lVar4 + -1] = (int)lVar1;
      if ((int)lVar1 < 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid num at argument ",0x18);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Numbers must be positive.",0x19);
        poVar2 = (ostream *)&std::cout;
        goto LAB_001016ab;
      }
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      return bVar3;
    }
  } while( true );
}

Assistant:

bool ValidInput(char *argv[], int numbers[])
{
    bool validNumbers = true;

    for(int i = 1; i < 4; i++)
    {

        char *endPtr;
        if(strtol(argv[i], &endPtr, 10))
        {
            numbers[i - 1] = static_cast<int>(strtol(argv[i], &endPtr, 10));

            if(numbers[i - 1] <= 0)
            {
                cout << "Invalid num at argument " << i << "!" << endl;
                cout << "Numbers must be positive." << endl;
                validNumbers = false;
            }
        }
        else
        {
            cout << "Invalid num at argument " << i << "!" << endl;
            validNumbers = false;
        }
    }

    return validNumbers;

}